

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

void __thiscall YAJLFrame::YAJLFrame(YAJLFrame *this,YAJLMiscData *misc,bitio_stream *bstream)

{
  vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *pvVar1;
  undefined8 *puVar2;
  pointer pYVar3;
  u16 marker;
  uint uVar4;
  long lVar5;
  ssize_t sVar6;
  undefined8 extraout_RAX;
  short sVar7;
  YAJLFrame **in_RCX;
  bitio_stream *extraout_RDX;
  bitio_stream *extraout_RDX_00;
  bitio_stream *extraout_RDX_01;
  bitio_stream *extraout_RDX_02;
  void *__buf;
  bitio_stream *extraout_RDX_03;
  bitio_stream *extraout_RDX_04;
  YAJLFrame *this_00;
  bool bVar8;
  YAJLFrame *local_68;
  YAJLMiscData *local_60;
  YAJLFrameHeader *local_58;
  u8 local_50;
  pointer local_48 [2];
  pointer local_38;
  
  lVar5 = 0x48;
  do {
    puVar2 = (undefined8 *)((long)&(this->tables).qtables[0].coeffs + lVar5);
    *puVar2 = 0;
    puVar2[1] = 0;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x108);
  pvVar1 = &(this->header).specs;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar8 = true;
  local_68 = (YAJLFrame *)bstream;
  local_60 = misc;
  do {
    this_00 = local_68;
    sVar6 = bitio::bitio_stream::read((bitio_stream *)local_68,0x10,bstream,(size_t)in_RCX);
    uVar4 = (uint)sVar6;
    in_RCX = (YAJLFrame **)(ulong)(uVar4 & 0xfff0);
    sVar7 = (short)(uVar4 & 0xfff0);
    if (sVar7 == -0x20) {
      YAJLMiscData::fetch_app_data(local_60,(bitio_stream *)local_68);
      bstream = extraout_RDX;
    }
    else {
      marker = (u16)sVar6;
      if (marker == 0xffdb) {
        YAJLTables::fetch_qtable(&this->tables,(bitio_stream *)local_68);
        bstream = extraout_RDX_01;
      }
      else if ((uVar4 & 0xffff) == 0xfffe) {
        YAJLMiscData::fetch_comment(local_60,(bitio_stream *)local_68);
        bstream = extraout_RDX_00;
      }
      else if ((uVar4 & 0xfff7) == 0xffc4) {
        YAJLTables::fetch_etable(&this->tables,marker,(bitio_stream *)local_68);
        bstream = extraout_RDX_02;
      }
      else if ((uVar4 & 0xffff) == 0xffdc) {
        bitio::bitio_stream::skip((bitio_stream *)local_68,0x10);
        sVar6 = bitio::bitio_stream::read((bitio_stream *)local_68,0x10,__buf,(size_t)in_RCX);
        (this->header).nlines = (u16)sVar6;
        bstream = extraout_RDX_03;
      }
      else {
        if ((sVar7 != -0x40) ||
           ((uVar4 = (uVar4 & 0xffff) - 0xffc4, uVar4 < 9 && ((0x111U >> (uVar4 & 0x1f) & 1) != 0)))
           ) {
          YAJLFrame(this_00);
          std::vector<YAJLScan,_std::allocator<YAJLScan>_>::~vector(&this->scans);
          pYVar3 = (pvVar1->
                   super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pYVar3 != (pointer)0x0) {
            operator_delete(pYVar3,(long)(this->header).specs.
                                         super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pYVar3);
          }
          _Unwind_Resume(extraout_RAX);
        }
        YAJLFrameHeader::YAJLFrameHeader
                  ((YAJLFrameHeader *)&local_58,marker,(bitio_stream *)local_68);
        (this->header).ncomponents = local_50;
        *(YAJLFrameHeader **)&this->header = local_58;
        std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::_M_move_assign
                  (pvVar1,local_48);
        if (local_48[0] != (pointer)0x0) {
          operator_delete(local_48[0],(long)local_38 - (long)local_48[0]);
        }
        in_RCX = &local_68;
        local_58 = &this->header;
        std::vector<YAJLScan,std::allocator<YAJLScan>>::
        emplace_back<YAJLMiscData*&,YAJLFrameHeader*,bitio::bitio_stream*&>
                  ((vector<YAJLScan,std::allocator<YAJLScan>> *)&this->scans,&local_60,&local_58,
                   (bitio_stream **)&local_68);
        bVar8 = false;
        printf("Run completed at: %s for \'Frame\'\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
              );
        bstream = extraout_RDX_04;
      }
    }
    if (!bVar8) {
      return;
    }
  } while( true );
}

Assistant:

YAJLFrame::YAJLFrame(YAJLMiscData *misc, bitio::bitio_stream *bstream) {
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::DNL) {
            // skip the length parameter as we know that Nl is a u16.
            bstream->skip(0x10);
            header.nlines = bstream->read(0x10);
        } else if (markers::is_sof_marker(marker)) {
            header = YAJLFrameHeader(marker, bstream);
            // now we parse one Scan

            scans.emplace_back(misc, &header, bstream);
#ifdef DEBUG
            printf("Run completed at: %s for 'Frame'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}